

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O3

void __thiscall Ptex::v2_2::PtexReader::readConstData(PtexReader *this)

{
  ushort uVar1;
  int alphachan;
  uint8_t *data;
  int unzipsize;
  
  if (this->_constdata != (uint8_t *)0x0) {
    return;
  }
  seek(this,this->_constdatapos);
  unzipsize = (this->_header).nfaces * this->_pixelsize;
  data = (uint8_t *)operator_new__((long)unzipsize);
  this->_constdata = data;
  readZipBlock(this,data,(this->_header).constdatasize,unzipsize);
  if (this->_premultiply == true) {
    alphachan = (this->_header).alphachan;
    uVar1 = (this->_header).nchannels;
    if (alphachan < (int)(uint)uVar1 && -1 < alphachan) {
      PtexUtils::multalpha
                (this->_constdata,(this->_header).nfaces,(this->_header).datatype,(uint)uVar1,
                 alphachan);
    }
  }
  if (unzipsize != 0) {
    LOCK();
    this->_memUsed = this->_memUsed + (long)unzipsize;
    UNLOCK();
  }
  return;
}

Assistant:

void PtexReader::readConstData()
{
    if (!_constdata) {
        // read compressed constant data block
        seek(_constdatapos);
        int size = _pixelsize * _header.nfaces;
        _constdata = new uint8_t[size];
        readZipBlock(_constdata, _header.constdatasize, size);
        if (_premultiply && _header.hasAlpha())
            PtexUtils::multalpha(_constdata, _header.nfaces, datatype(),
                                 _header.nchannels, _header.alphachan);
        increaseMemUsed(size);
    }
}